

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O2

void exitProg(void)

{
  endwin();
  zvgFrameClose();
  exit(0);
}

Assistant:

void exitProg( void)
{
#if defined(WIN32)
#elif defined(linux)

	endwin();

#else // DOS
#endif // OS

	zvgFrameClose();							// turn off DMA and free DMA buffers
	exit( 0);
}